

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cc
# Opt level: O1

void google::glog_internal_namespace_::InitGoogleLoggingUtilities(char *argv0)

{
  char *pcVar1;
  ostream *poVar2;
  LogMessage LStack_18;
  
  if (g_program_invocation_short_name == (char *)0x0) {
    pcVar1 = strrchr(argv0,0x2f);
    g_program_invocation_short_name = pcVar1 + 1;
    if (pcVar1 == (char *)0x0) {
      g_program_invocation_short_name = argv0;
    }
    g_main_thread_id = pthread_self();
    InstallFailureFunction(DumpStackTraceAndExit);
    return;
  }
  LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&LStack_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/utilities.cc"
             ,0x15a);
  poVar2 = LogMessage::stream(&LStack_18);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"Check failed: !IsGoogleLoggingInitialized() ",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"You called InitGoogleLogging() twice!",0x25);
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_18);
}

Assistant:

bool IsGoogleLoggingInitialized() {
  return g_program_invocation_short_name != NULL;
}